

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

bool ON_Font::EqualFontFamily(ON_Font *lhs,ON_Font *rhs)

{
  bool bVar1;
  bool bVar2;
  NameLocale name_locale;
  NameLocale name_locale_00;
  undefined1 local_40 [16];
  undefined1 local_30 [16];
  
  if (rhs == (ON_Font *)0x0 || lhs == (ON_Font *)0x0) {
LAB_0049f040:
    bVar2 = false;
  }
  else {
    bVar2 = true;
    if (lhs == rhs) {
      return true;
    }
    bVar1 = Internal_EqualName(&lhs->m_en_family_name,&rhs->m_en_family_name);
    if (bVar1) {
      return true;
    }
    name_locale = (NameLocale)lhs;
    FamilyName((ON_Font *)(local_40 + 8),name_locale);
    name_locale_00 = (NameLocale)rhs;
    FamilyName((ON_Font *)local_40,name_locale_00);
    bVar1 = Internal_EqualName((ON_wString *)(local_40 + 8),(ON_wString *)local_40);
    ON_wString::~ON_wString((ON_wString *)local_40);
    ON_wString::~ON_wString((ON_wString *)(local_40 + 8));
    if (bVar1) {
      return true;
    }
    FaceName((ON_Font *)(local_40 + 8));
    bVar1 = ON_wString::IsNotEmpty((ON_wString *)(local_40 + 8));
    if (bVar1) {
      FamilyName((ON_Font *)local_40);
      bVar1 = ON_wString::IsNotEmpty((ON_wString *)local_40);
      ON_wString::~ON_wString((ON_wString *)local_40);
      ON_wString::~ON_wString((ON_wString *)(local_40 + 8));
      if (bVar1) goto LAB_0049f040;
    }
    else {
      ON_wString::~ON_wString((ON_wString *)(local_40 + 8));
    }
    bVar1 = Internal_EqualName(&lhs->m_en_postscript_name,&rhs->m_en_postscript_name);
    if ((!bVar1) &&
       (bVar1 = Internal_EqualName(&lhs->m_en_windows_logfont_name,&rhs->m_en_windows_logfont_name),
       !bVar1)) {
      PostScriptName((ON_Font *)(local_40 + 8),name_locale);
      PostScriptName((ON_Font *)local_40,name_locale_00);
      bVar1 = Internal_EqualName((ON_wString *)(local_40 + 8),(ON_wString *)local_40);
      bVar2 = true;
      if (!bVar1) {
        WindowsLogfontName((ON_Font *)(local_30 + 8),name_locale);
        WindowsLogfontName((ON_Font *)local_30,name_locale_00);
        bVar2 = Internal_EqualName((ON_wString *)(local_30 + 8),(ON_wString *)local_30);
        ON_wString::~ON_wString((ON_wString *)local_30);
        ON_wString::~ON_wString((ON_wString *)(local_30 + 8));
      }
      ON_wString::~ON_wString((ON_wString *)local_40);
      ON_wString::~ON_wString((ON_wString *)(local_40 + 8));
    }
  }
  return bVar2;
}

Assistant:

bool ON_Font::EqualFontFamily(
  const ON_Font* lhs,
  const ON_Font* rhs
)
{
  if (nullptr == lhs || nullptr == rhs)
    return false;
  if (lhs == rhs)
    return true;

  if (Internal_EqualName(lhs->m_en_family_name, rhs->m_en_family_name))
    return true;
  if (Internal_EqualName(lhs->FamilyName(ON_Font::NameLocale::LocalizedFirst), rhs->FamilyName(ON_Font::NameLocale::LocalizedFirst)))
    return true;
  if (lhs->FaceName().IsNotEmpty() && rhs->FamilyName().IsNotEmpty())
    return false; // both lhs and rhs have non-empty family names.

  // Testing PostScript, and LOGFONT names handles cases where the family name is missing.
  const bool rc
    = Internal_EqualName(lhs->m_en_postscript_name, rhs->m_en_postscript_name)
    || Internal_EqualName(lhs->m_en_windows_logfont_name, rhs->m_en_windows_logfont_name)
    || Internal_EqualName(lhs->PostScriptName(ON_Font::NameLocale::LocalizedFirst),rhs->PostScriptName(ON_Font::NameLocale::LocalizedFirst))
    || Internal_EqualName(lhs->WindowsLogfontName(ON_Font::NameLocale::LocalizedFirst),rhs->WindowsLogfontName(ON_Font::NameLocale::LocalizedFirst))
    ;
  return rc;
}